

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MemoryManager.cpp
# Opt level: O2

void __thiscall
Lodtalk::ClassTable::addSpecialClass(ClassTable *this,ClassDescription *description,size_t index)

{
  ulong uVar1;
  WriteLock<Lodtalk::SharedMutex> l;
  WriteLock<Lodtalk::SharedMutex> local_30;
  
  local_30.mutex = &this->sharedMutex;
  SharedMutex::write_lock(&this->sharedMutex);
  for (uVar1 = (long)(this->pageTable).
                     super__Vector_base<Lodtalk::Oop_*,_std::allocator<Lodtalk::Oop_*>_>._M_impl.
                     super__Vector_impl_data._M_finish -
               (long)(this->pageTable).
                     super__Vector_base<Lodtalk::Oop_*,_std::allocator<Lodtalk::Oop_*>_>._M_impl.
                     super__Vector_impl_data._M_start >> 3; uVar1 <= index >> 9; uVar1 = uVar1 + 1)
  {
    allocatePage(this);
  }
  (this->pageTable).super__Vector_base<Lodtalk::Oop_*,_std::allocator<Lodtalk::Oop_*>_>._M_impl.
  super__Vector_impl_data._M_start[index >> 9][(uint)index & 0x1ff].field_0.header =
       (ObjectHeader *)description;
  uVar1 = index + 1;
  if (index + 1 < this->size) {
    uVar1 = this->size;
  }
  this->size = uVar1;
  (description->super_Behavior).super_Object.super_ProtoObject.object_header_ =
       (ObjectHeader)
       ((ulong)(description->super_Behavior).super_Object.super_ProtoObject.object_header_ &
        0xffffffff000003ff | (ulong)((uint)index << 10));
  WriteLock<Lodtalk::SharedMutex>::~WriteLock(&local_30);
  return;
}

Assistant:

void ClassTable::addSpecialClass(ClassDescription *description, size_t index)
{
    WriteLock<SharedMutex> l(sharedMutex);
    auto pageIndex = index / OopsPerPage;
    auto elementIndex = index % OopsPerPage;

    for(size_t i = pageTable.size(); i < pageIndex + 1; ++i)
        allocatePage();

    pageTable[pageIndex][elementIndex] = Oop::fromPointer(description);
    size = std::max(size, index + 1);
    description->object_header_.identityHash = (unsigned int)index;
}